

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O2

void * Abc_NtkBuildGlobalBdds
                 (Abc_Ntk_t *pNtk,int nBddSizeMax,int fDropInternal,int fReorder,int fReverse,
                 int fVerbose)

{
  int iVar1;
  void *pvVar2;
  DdManager *unique;
  int *piVar3;
  Abc_Obj_t *pAVar4;
  ProgressBar *p;
  DdNode *pDVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int Counter;
  
  Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  pvVar2 = Abc_NtkGlobalBdd(pNtk);
  if (pvVar2 != (void *)0x0) {
    __assert_fail("Abc_NtkGlobalBdd(pNtk) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                  ,0x148,"void *Abc_NtkBuildGlobalBdds(Abc_Ntk_t *, int, int, int, int, int)");
  }
  unique = Cudd_Init(pNtk->vCis->nSize,0,0x100,0x40000,0);
  iVar11 = pNtk->vObjs->nSize;
  piVar3 = (int *)calloc(1,0x30);
  iVar11 = iVar11 + 1;
  *(DdManager **)(piVar3 + 4) = unique;
  *(code **)(piVar3 + 6) = Extra_StopManager;
  iVar1 = 0x10;
  if (iVar11 != 0) {
    iVar1 = iVar11;
  }
  *(code **)(piVar3 + 10) = Cudd_RecursiveDeref;
  *piVar3 = iVar1;
  pvVar2 = calloc(1,(long)iVar1 << 3);
  *(void **)(piVar3 + 2) = pvVar2;
  if (7 < pNtk->vAttrs->nSize) {
    pNtk->vAttrs->pArray[7] = piVar3;
    if (fReorder != 0) {
      Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
    }
    pAVar4 = Abc_AigConst1(pNtk);
    if (0 < (pAVar4->vFanouts).nSize) {
      pDVar5 = unique->one;
      Abc_ObjSetGlobalBdd(pAVar4,pDVar5);
      Cudd_Ref(pDVar5);
    }
    iVar11 = -1;
    for (lVar10 = 0; lVar10 < pNtk->vCis->nSize; lVar10 = lVar10 + 1) {
      pAVar4 = Abc_NtkCi(pNtk,(int)lVar10);
      if (0 < (pAVar4->vFanouts).nSize) {
        lVar7 = lVar10;
        if (fReverse != 0) {
          lVar7 = (long)(pNtk->vCis->nSize + iVar11);
        }
        pDVar5 = unique->vars[lVar7];
        Abc_ObjSetGlobalBdd(pAVar4,pDVar5);
        Cudd_Ref(pDVar5);
      }
      iVar11 = iVar11 + -1;
    }
    Counter = 0;
    p = Extra_ProgressBarStart(_stdout,pNtk->nObjCounts[7]);
    iVar11 = 0;
    while( true ) {
      if (pNtk->vCos->nSize <= iVar11) {
        Extra_ProgressBarStop(p);
        for (iVar11 = 0; iVar1 = pNtk->vObjs->nSize, iVar11 < iVar1; iVar11 = iVar11 + 1) {
          pAVar4 = Abc_NtkObj(pNtk,iVar11);
          if ((((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xe) != 8)) &&
              (uVar6 = *(uint *)&pAVar4->field_0x14 & 0xf, uVar6 != 4)) && (uVar6 != 10)) {
            (pAVar4->vFanouts).nSize = 0;
          }
        }
        for (iVar11 = 0; iVar11 < iVar1; iVar11 = iVar11 + 1) {
          pAVar4 = Abc_NtkObj(pNtk,iVar11);
          if (((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xe) != 8)) &&
             ((uVar6 = *(uint *)&pAVar4->field_0x14 & 0xf, uVar6 != 5 && (uVar6 != 10)))) {
            uVar6 = (pAVar4->vFanins).nSize;
            uVar8 = (ulong)uVar6;
            if ((int)uVar6 < 1) {
              uVar8 = 0;
            }
            for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
              piVar3 = (int *)((long)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[uVar9]] +
                              0x2c);
              *piVar3 = *piVar3 + 1;
            }
          }
          iVar1 = pNtk->vObjs->nSize;
        }
        if (fReorder != 0) {
          Cudd_ReduceHeap(unique,CUDD_REORDER_SYMM_SIFT,1);
          Cudd_AutodynDisable(unique);
        }
        return unique;
      }
      pAVar4 = Abc_NtkCo(pNtk,iVar11);
      pDVar5 = Abc_NodeGlobalBdds_rec
                         (unique,(Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray]
                          ,nBddSizeMax,fDropInternal,p,&Counter,fVerbose);
      if (pDVar5 == (DdNode *)0x0) break;
      pDVar5 = (DdNode *)((ulong)(*(uint *)&pAVar4->field_0x14 >> 10 & 1) ^ (ulong)pDVar5);
      Cudd_Ref(pDVar5);
      Abc_ObjSetGlobalBdd(pAVar4,pDVar5);
      iVar11 = iVar11 + 1;
    }
    if (fVerbose != 0) {
      puts("Constructing global BDDs is aborted.");
    }
    Abc_NtkFreeGlobalBdds(pNtk,0);
    Cudd_Quit(unique);
    for (iVar11 = 0; iVar1 = pNtk->vObjs->nSize, iVar11 < iVar1; iVar11 = iVar11 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar11);
      if (((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xe) != 8)) &&
         ((uVar6 = *(uint *)&pAVar4->field_0x14 & 0xf, uVar6 != 4 && (uVar6 != 10)))) {
        (pAVar4->vFanouts).nSize = 0;
      }
    }
    for (iVar11 = 0; iVar11 < iVar1; iVar11 = iVar11 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar11);
      if ((((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xe) != 8)) &&
          (uVar6 = *(uint *)&pAVar4->field_0x14 & 0xf, uVar6 != 5)) && (uVar6 != 10)) {
        uVar6 = (pAVar4->vFanins).nSize;
        uVar8 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar8 = 0;
        }
        for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          piVar3 = (int *)((long)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[uVar9]] + 0x2c
                          );
          *piVar3 = *piVar3 + 1;
        }
      }
      iVar1 = pNtk->vObjs->nSize;
    }
    return (void *)0x0;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

void * Abc_NtkBuildGlobalBdds( Abc_Ntk_t * pNtk, int nBddSizeMax, int fDropInternal, int fReorder, int fReverse, int fVerbose )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pObj, * pFanin;
    Vec_Att_t * pAttMan;
    DdManager * dd;
    DdNode * bFunc;
    int i, k, Counter;

    // remove dangling nodes
    Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );

    // start the manager
    assert( Abc_NtkGlobalBdd(pNtk) == NULL );
    dd = Cudd_Init( Abc_NtkCiNum(pNtk), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    pAttMan = Vec_AttAlloc( Abc_NtkObjNumMax(pNtk) + 1, dd, (void (*)(void*))Extra_StopManager, NULL, (void (*)(void*,void*))Cudd_RecursiveDeref );
    Vec_PtrWriteEntry( pNtk->vAttrs, VEC_ATTR_GLOBAL_BDD, pAttMan );

    // set reordering
    if ( fReorder )
        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );

    // assign the constant node BDD
    pObj = Abc_AigConst1(pNtk);
    if ( Abc_ObjFanoutNum(pObj) > 0 )
    {
        bFunc = dd->one;
        Abc_ObjSetGlobalBdd( pObj, bFunc );   Cudd_Ref( bFunc );
    }
    // set the elementary variables
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) > 0 )
        {
            bFunc = fReverse ? dd->vars[Abc_NtkCiNum(pNtk) - 1 - i] : dd->vars[i];
            Abc_ObjSetGlobalBdd( pObj, bFunc );  Cudd_Ref( bFunc );
        }

    // collect the global functions of the COs
    Counter = 0;
    // construct the BDDs
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        bFunc = Abc_NodeGlobalBdds_rec( dd, Abc_ObjFanin0(pObj), nBddSizeMax, fDropInternal, pProgress, &Counter, fVerbose );
        if ( bFunc == NULL )
        {
            if ( fVerbose )
            printf( "Constructing global BDDs is aborted.\n" );
            Abc_NtkFreeGlobalBdds( pNtk, 0 );
            Cudd_Quit( dd ); 

            // reset references
            Abc_NtkForEachObj( pNtk, pObj, i )
                if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBi(pObj) )
                    pObj->vFanouts.nSize = 0;
            Abc_NtkForEachObj( pNtk, pObj, i )
                if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
                    Abc_ObjForEachFanin( pObj, pFanin, k )
                        pFanin->vFanouts.nSize++;
            return NULL;
        }
        bFunc = Cudd_NotCond( bFunc, (int)Abc_ObjFaninC0(pObj) );  Cudd_Ref( bFunc ); 
        Abc_ObjSetGlobalBdd( pObj, bFunc );
    }
    Extra_ProgressBarStop( pProgress );

/*
    // derefence the intermediate BDDs
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( pObj->pCopy ) 
        {
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pCopy );
            pObj->pCopy = NULL;
        }
*/
/*
    // make sure all nodes are derefed
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( pObj->pCopy != NULL )
            printf( "Abc_NtkBuildGlobalBdds() error: Node %d has BDD assigned\n", pObj->Id );
        if ( pObj->vFanouts.nSize > 0 )
            printf( "Abc_NtkBuildGlobalBdds() error: Node %d has refs assigned\n", pObj->Id );
    }
*/
    // reset references
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBi(pObj) )
            pObj->vFanouts.nSize = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                pFanin->vFanouts.nSize++;

    // reorder one more time
    if ( fReorder )
    {
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 1 );
        Cudd_AutodynDisable( dd );
    }
//    Cudd_PrintInfo( dd, stdout );
    return dd;
}